

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemView::rowsAboutToBeRemoved
          (QAbstractItemView *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  Span *pSVar2;
  QWidget *editor;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  QAbstractItemViewPrivate *d;
  int iVar8;
  long in_FS_OFFSET;
  piter local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a8;
  undefined8 local_98;
  undefined1 *puStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QModelIndex local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  this_00->state = CollapsingState;
  local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  currentIndex((QModelIndex *)&local_98,this);
  if (((((this_00->selectionMode != SingleSelection) || (end < (int)local_98)) ||
       ((int)local_98 < start)) || (((int)local_98 < 0 || ((long)local_98 < 0)))) ||
     (local_88.ptr == (QAbstractItemModel *)0x0)) goto LAB_004e8ad3;
  QModelIndex::parent((QModelIndex *)&local_58,(QModelIndex *)&local_98);
  bVar3 = ::comparesEqual((QModelIndex *)&local_58,parent);
  if (!bVar3) goto LAB_004e8ad3;
  iVar5 = (**(code **)(*(long *)this_00->model + 0x78))(this_00->model,parent);
  if (iVar5 <= (end - start) + 1) {
    tStack_48.ptr = (parent->m).ptr;
    local_58 = *(undefined1 **)parent;
    uStack_50 = (undefined1 *)parent->i;
    while ((bVar3 = ::operator!=((QModelIndex *)&local_58,&this_00->root), bVar3 &&
           (uVar7 = (**(code **)(*(long *)this_00->model + 0x138))
                              (this_00->model,(QModelIndex *)&local_58), (uVar7 & 0x20) == 0))) {
      QModelIndex::parent(&local_78,(QModelIndex *)&local_58);
      tStack_48.ptr = local_78.m.ptr;
      local_58 = (undefined1 *)CONCAT44(local_78.c,local_78.r);
      uStack_50 = (undefined1 *)CONCAT44(local_78.i._4_4_,(undefined4)local_78.i);
    }
    bVar3 = ::operator!=((QModelIndex *)&local_58,&this_00->root);
    if (bVar3) {
      setCurrentIndex(this,(QModelIndex *)&local_58);
    }
    goto LAB_004e8ad3;
  }
  local_58 = (undefined1 *)0xffffffffffffffff;
  uStack_50 = (undefined1 *)0x0;
  tStack_48.ptr = (QAbstractItemModel *)0x0;
  iVar6 = (**(code **)(*(long *)this_00->model + 0x78))(this_00->model,parent);
  iVar5 = end;
  do {
    iVar5 = iVar5 + 1;
    iVar8 = start;
    if (iVar6 <= iVar5) goto LAB_004e8a24;
    pQVar1 = this_00->model;
    iVar8 = local_98._4_4_;
    QModelIndex::parent((QModelIndex *)&local_b8,(QModelIndex *)&local_98);
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_78,pQVar1,iVar5,iVar8,&local_b8);
    tStack_48.ptr = local_78.m.ptr;
    local_58 = (undefined1 *)CONCAT44(local_78.c,local_78.r);
    uStack_50 = (undefined1 *)CONCAT44(local_78.i._4_4_,(undefined4)local_78.i);
    cVar4 = (**(code **)(*(long *)this + 0x2c0))(this,&local_58);
  } while ((cVar4 != '\0') ||
          (uVar7 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_58),
          (uVar7 & 0x20) == 0));
  goto LAB_004e8ac3;
  while( true ) {
    iVar8 = iVar8 + -1;
    pQVar1 = this_00->model;
    iVar5 = local_98._4_4_;
    QModelIndex::parent((QModelIndex *)&local_b8,(QModelIndex *)&local_98);
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_78,pQVar1,iVar8,iVar5,&local_b8);
    tStack_48.ptr = local_78.m.ptr;
    local_58 = (undefined1 *)CONCAT44(local_78.c,local_78.r);
    uStack_50 = (undefined1 *)CONCAT44(local_78.i._4_4_,(undefined4)local_78.i);
    cVar4 = (**(code **)(*(long *)this + 0x2c0))(this,&local_58);
    if ((cVar4 == '\0') &&
       (uVar7 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_58),
       (uVar7 & 0x20) != 0)) break;
LAB_004e8a24:
    if (iVar8 < 1) break;
  }
LAB_004e8ac3:
  setCurrentIndex(this,(QModelIndex *)&local_58);
LAB_004e8ad3:
  local_c8 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::begin(&this_00->editorIndexHash);
LAB_004e8b16:
  do {
    if (local_c8.d == (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0 &&
        local_c8.bucket == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    local_a8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    pSVar2 = (local_c8.d)->spans;
    uVar7 = local_c8.bucket >> 7;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_b8,
               (QPersistentModelIndex *)
               (pSVar2[uVar7].entries[pSVar2[uVar7].offsets[(uint)local_c8.bucket & 0x7f]].storage.
                data + 8));
    local_78.m.ptr = local_a8.ptr;
    local_78.r = (int)local_b8;
    local_78.c = local_b8._4_4_;
    local_78.i._0_4_ = (undefined4)uStack_b0;
    local_78.i._4_4_ = uStack_b0._4_4_;
    while( true ) {
      if (((local_78.r < 0) || (local_78.c < 0)) || (local_78.m.ptr == (QAbstractItemModel *)0x0))
      goto LAB_004e8cf3;
      tStack_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::parent((QModelIndex *)&local_58,&local_78);
      bVar3 = ::comparesEqual((QModelIndex *)&local_58,parent);
      if (bVar3) break;
      local_78.m.ptr = tStack_48.ptr;
      local_78.r = (int)local_58;
      local_78.c = local_58._4_4_;
      local_78.i._0_4_ = (undefined4)uStack_50;
      local_78.i._4_4_ = uStack_50._4_4_;
    }
    if (((local_78.r <= end) && (start <= local_78.r)) &&
       ((-1 < local_78.r && ((-1 < local_78.c && (local_78.m.ptr != (QAbstractItemModel *)0x0))))))
    {
      editor = *(QWidget **)
                (local_c8.d)->spans[local_c8.bucket >> 7].entries
                [(local_c8.d)->spans[local_c8.bucket >> 7].offsets[(uint)local_c8.bucket & 0x7f]].
                storage.data;
      tStack_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)&local_78,(QModelIndex *)&local_b8);
      QHash<QPersistentModelIndex,_QEditorInfo>::takeImpl<QPersistentModelIndex>
                ((QEditorInfo *)&local_58,&this_00->indexEditorHash,
                 (QPersistentModelIndex *)&local_78);
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_78);
      local_c8 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::erase
                                  (&this_00->editorIndexHash,(const_iterator)local_c8);
      bVar3 = QPointer::operator_cast_to_bool((QPointer *)&local_58);
      if (bVar3) {
        QAbstractItemViewPrivate::releaseEditor(this_00,editor,(QModelIndex *)&local_b8);
      }
      QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_58);
      goto LAB_004e8b16;
    }
LAB_004e8cf3:
    QHashPrivate::iterator<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_>::operator++
              (&local_c8);
  } while( true );
}

Assistant:

void QAbstractItemView::rowsAboutToBeRemoved(const QModelIndex &parent, int start, int end)
{
    Q_D(QAbstractItemView);

    setState(CollapsingState);

    // Ensure one selected item in single selection mode.
    QModelIndex current = currentIndex();
    if (d->selectionMode == SingleSelection
        && current.isValid()
        && current.row() >= start
        && current.row() <= end
        && current.parent() == parent) {
        int totalToRemove = end - start + 1;
        if (d->model->rowCount(parent) <= totalToRemove) { // no more children
            QModelIndex index = parent;
            while (index != d->root && !d->isIndexEnabled(index))
                index = index.parent();
            if (index != d->root)
                setCurrentIndex(index);
        } else {
            int row = end + 1;
            QModelIndex next;
            const int rowCount = d->model->rowCount(parent);
            bool found = false;
            // find the next visible and enabled item
            while (row < rowCount && !found) {
                next = d->model->index(row++, current.column(), current.parent());
#ifdef QT_DEBUG
                if (!next.isValid()) {
                    qWarning("Model unexpectedly returned an invalid index");
                    break;
                }
#endif
                if (!isIndexHidden(next) && d->isIndexEnabled(next)) {
                    found = true;
                    break;
                }
            }

            if (!found) {
                row = start - 1;
                // find the previous visible and enabled item
                while (row >= 0) {
                    next = d->model->index(row--, current.column(), current.parent());
#ifdef QT_DEBUG
                    if (!next.isValid()) {
                        qWarning("Model unexpectedly returned an invalid index");
                        break;
                    }
#endif
                    if (!isIndexHidden(next) && d->isIndexEnabled(next))
                        break;
                }
            }

            setCurrentIndex(next);
        }
    }

    // Remove all affected editors; this is more efficient than waiting for updateGeometries() to clean out editors for invalid indexes
    const auto findDirectChildOf = [](const QModelIndex &parent, QModelIndex child)
    {
        while (child.isValid()) {
            const auto parentIndex = child.parent();
            if (parentIndex == parent)
                return child;
            child = parentIndex;
        }
        return QModelIndex();
    };
    QEditorIndexHash::iterator i = d->editorIndexHash.begin();
    while (i != d->editorIndexHash.end()) {
        const QModelIndex index = i.value();
        const QModelIndex directChild = findDirectChildOf(parent, index);
        if (directChild.isValid() && directChild.row() >= start && directChild.row() <= end) {
            QWidget *editor = i.key();
            QEditorInfo info = d->indexEditorHash.take(index);
            i = d->editorIndexHash.erase(i);
            if (info.widget)
                d->releaseEditor(editor, index);
        } else {
            ++i;
        }
    }
}